

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O3

int dasm_link(BuildCtx *ctx,size_t *szp)

{
  uint uVar1;
  int iVar2;
  dasm_State *pdVar3;
  int *piVar4;
  dasm_ActList puVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  int iVar13;
  dasm_ActList puVar14;
  dasm_ActList puVar15;
  int *piVar16;
  int iVar17;
  size_t sVar18;
  ulong uVar19;
  bool bVar20;
  int *local_58;
  
  pdVar3 = ctx->D;
  *szp = 0;
  iVar10 = pdVar3->status;
  if (iVar10 == 0) {
    if (pdVar3->pcsize != 0) {
      uVar12 = 0;
      uVar7 = 0;
      do {
        if (0 < *(int *)((long)pdVar3->pclabels + uVar12)) {
          return uVar7 | 0x22000000;
        }
        uVar7 = uVar7 + 1;
        uVar12 = uVar12 + 4;
      } while (uVar12 < pdVar3->pcsize);
    }
    uVar12 = pdVar3->lgsize;
    if (0x28 < uVar12) {
      piVar4 = pdVar3->lglabels;
      lVar11 = 10;
      do {
        if (0 < piVar4[lVar11]) {
          uVar7 = piVar4[lVar11];
          do {
            piVar16 = pdVar3->sections[uVar7 >> 0x18].rbuf;
            uVar1 = piVar16[uVar7];
            piVar16[uVar7] = -(int)lVar11;
            uVar7 = uVar1;
          } while (0 < (int)uVar1);
        }
        bVar20 = lVar11 != (uVar12 - 0x29 >> 2) + 10;
        lVar11 = lVar11 + 1;
      } while (bVar20);
    }
    iVar10 = pdVar3->maxsection;
    if (0 < iVar10) {
      local_58 = &pdVar3->sections[0].ofs;
      uVar12 = 0;
      sVar18 = 0;
LAB_0010604c:
      iVar17 = (int)sVar18;
      iVar13 = (int)uVar12 << 0x18;
      iVar2 = pdVar3->sections[uVar12].pos;
      if (iVar13 != iVar2) {
        piVar4 = pdVar3->sections[uVar12].rbuf;
        puVar5 = pdVar3->actionlist;
LAB_00106077:
        lVar11 = (long)iVar13;
        iVar13 = iVar13 + 1;
        bVar6 = 0;
        puVar15 = puVar5 + piVar4[lVar11];
switchD_001060a7_caseD_fd:
        puVar14 = puVar15;
        iVar17 = (int)sVar18;
        puVar15 = puVar14 + 1;
        switch(*puVar14) {
        case 0xf0:
        case 0xf1:
        case 0xf6:
          puVar15 = puVar14 + 2;
          break;
        case 0xf4:
          puVar15 = puVar14 + 2;
        case 0xf5:
          iVar10 = (uint)((bVar6 & 0xf0) == 0x80) << 2;
          if (bVar6 == 0xe9) {
            iVar10 = 3;
          }
          iVar8 = 0;
          if (iVar10 != 0) {
            uVar7 = piVar4[iVar13];
            if (-1 < (int)uVar7) {
              uVar19 = (ulong)(uVar7 >> 0x18);
              iVar9 = pdVar3->sections[uVar19].rbuf[uVar7];
              if (iVar13 < (int)uVar7) {
                piVar16 = local_58;
                if (uVar12 < uVar19) {
                  do {
                    iVar9 = iVar9 + *piVar16;
                    uVar19 = uVar19 - 1;
                    piVar16 = piVar16 + 10;
                  } while (uVar12 != uVar19);
                }
              }
              else {
                iVar9 = iVar9 - iVar17;
              }
              iVar8 = iVar10;
              if (0x7f < iVar9 - piVar4[(long)iVar13 + 1]) {
                iVar8 = 0;
              }
              if (iVar9 - piVar4[(long)iVar13 + 1] < -0x80 - iVar10) {
                iVar8 = 0;
              }
              sVar18 = (size_t)(uint)(iVar17 - iVar8);
            }
          }
          piVar4[(long)iVar13 + 1] = iVar8;
          iVar13 = iVar13 + 2;
          goto switchD_001060a7_caseD_fd;
        case 0xf8:
          puVar15 = puVar14 + 2;
        case 0xf9:
          lVar11 = (long)iVar13;
          iVar13 = iVar13 + 1;
          piVar4[lVar11] = piVar4[lVar11] + iVar17;
          goto switchD_001060a7_caseD_fd;
        case 0xfa:
          lVar11 = (long)iVar13;
          iVar13 = iVar13 + 1;
          sVar18 = (size_t)(iVar17 - ((uint)puVar14[1] & piVar4[lVar11] + iVar17));
          puVar15 = puVar14 + 2;
          goto switchD_001060a7_caseD_fd;
        case 0xfb:
          puVar15 = puVar14 + 3;
          goto switchD_001060a7_caseD_fd;
        case 0xfc:
          goto switchD_001060a7_caseD_fc;
        default:
          goto switchD_001060a7_caseD_fd;
        case 0xfe:
        case 0xff:
          goto switchD_001060a7_caseD_fe;
        }
        iVar13 = iVar13 + 1;
        goto switchD_001060a7_caseD_fd;
      }
      goto LAB_001061c3;
    }
    sVar18 = 0;
LAB_001061f9:
    iVar10 = 0;
    pdVar3->codesize = sVar18;
    *szp = sVar18;
  }
  return iVar10;
switchD_001060a7_caseD_fe:
  if (iVar13 == iVar2) goto code_r0x001061b5;
  goto LAB_00106077;
code_r0x001061b5:
  iVar10 = pdVar3->maxsection;
LAB_001061c3:
  sVar18 = (long)iVar17 + (long)pdVar3->sections[uVar12].ofs;
  uVar12 = uVar12 + 1;
  local_58 = local_58 + 10;
  if ((long)iVar10 <= (long)uVar12) goto LAB_001061f9;
  goto LAB_0010604c;
switchD_001060a7_caseD_fc:
  bVar6 = puVar14[1];
  puVar15 = puVar14 + 2;
  goto switchD_001060a7_caseD_fd;
}

Assistant:

int dasm_link(Dst_DECL, size_t *szp)
{
  dasm_State *D = Dst_REF;
  int secnum;
  int ofs = 0;

#ifdef DASM_CHECKS
  *szp = 0;
  if (D->status != DASM_S_OK) return D->status;
  {
    int pc;
    for (pc = 0; pc*sizeof(int) < D->pcsize; pc++)
      if (D->pclabels[pc] > 0) return DASM_S_UNDEF_PC|pc;
  }
#endif

  { /* Handle globals not defined in this translation unit. */
    int idx;
    for (idx = 10; idx*sizeof(int) < D->lgsize; idx++) {
      int n = D->lglabels[idx];
      /* Undefined label: Collapse rel chain and replace with marker (< 0). */
      while (n > 0) { int *pb = DASM_POS2PTR(D, n); n = *pb; *pb = -idx; }
    }
  }

  /* Combine all code sections. No support for data sections (yet). */
  for (secnum = 0; secnum < D->maxsection; secnum++) {
    dasm_Section *sec = D->sections + secnum;
    int *b = sec->rbuf;
    int pos = DASM_SEC2POS(secnum);
    int lastpos = sec->pos;

    while (pos != lastpos) {
      dasm_ActList p = D->actionlist + b[pos++];
      int op = 0;
      while (1) {
	int action = *p++;
	switch (action) {
	case DASM_REL_LG: p++;
	  /* fallthrough */
	case DASM_REL_PC: {
	  int shrink = op == 0xe9 ? 3 : ((op&0xf0) == 0x80 ? 4 : 0);
	  if (shrink) {  /* Shrinkable branch opcode? */
	    int lofs, lpos = b[pos];
	    if (lpos < 0) goto noshrink;  /* Ext global? */
	    lofs = *DASM_POS2PTR(D, lpos);
	    if (lpos > pos) {  /* Fwd label: add cumulative section offsets. */
	      int i;
	      for (i = secnum; i < DASM_POS2SEC(lpos); i++)
		lofs += D->sections[i].ofs;
	    } else {
	      lofs -= ofs;  /* Bkwd label: unfix offset. */
	    }
	    lofs -= b[pos+1];  /* Short branch ok? */
	    if (lofs >= -128-shrink && lofs <= 127) ofs -= shrink;  /* Yes. */
	    else { noshrink: shrink = 0; }  /* No, cannot shrink op. */
	  }
	  b[pos+1] = shrink;
	  pos += 2;
	  break;
	}
	  /* fallthrough */
	case DASM_SPACE: case DASM_IMM_LG: case DASM_VREG: p++;
	  /* fallthrough */
	case DASM_DISP: case DASM_IMM_S: case DASM_IMM_B: case DASM_IMM_W:
	case DASM_IMM_D: case DASM_IMM_WB: case DASM_IMM_DB:
	case DASM_SETLABEL: case DASM_REL_A: case DASM_IMM_PC: pos++; break;
	case DASM_LABEL_LG: p++;
	  /* fallthrough */
	case DASM_LABEL_PC: b[pos++] += ofs; break; /* Fix label offset. */
	case DASM_ALIGN: ofs -= (b[pos++]+ofs)&*p++; break; /* Adjust ofs. */
	case DASM_EXTERN: p += 2; break;
	case DASM_ESC: op = *p++; break;
	case DASM_MARK: break;
	case DASM_SECTION: case DASM_STOP: goto stop;
	default: op = action; break;
	}
      }
      stop: (void)0;
    }
    ofs += sec->ofs;  /* Next section starts right after current section. */
  }

  D->codesize = ofs;  /* Total size of all code sections */
  *szp = ofs;
  return DASM_S_OK;
}